

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O3

void Omega_h::context_adding_routine
               (vector<int,_std::allocator<int>_> *lane,int zeta_pointer,Context *contexts_generated
               ,Contexts *contexts,bool verbose,GrammarPtr *grammar)

{
  uint uVar1;
  size_t sVar2;
  pointer piVar3;
  Contexts *pCVar4;
  GrammarPtr *pGVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  undefined3 in_register_00000081;
  int iVar10;
  ulong uVar11;
  char local_4e;
  char local_4d;
  int local_4c;
  Contexts *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  GrammarPtr *local_38;
  
  iVar10 = CONCAT31(in_register_00000081,verbose);
  uVar11 = (ulong)(uint)zeta_pointer;
  local_48 = contexts;
  local_40 = lane;
  local_38 = grammar;
  if (iVar10 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  CONTEXT ADDING ROUTINE\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  LANE:",7);
    print_stack((Omega_h *)
                (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start,
                (vector<int,_std::allocator<int>_> *)
                (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  $\\zeta$-POINTER = ",0x14);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,zeta_pointer);
    local_4d = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4d,1);
  }
  if (-1 < zeta_pointer) {
    sVar2 = (contexts_generated->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_4c = iVar10;
    pCVar4 = local_48;
    while (sVar2 != 0) {
      piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_48 = pCVar4;
      if ((long)(int)((ulong)((long)(local_40->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2)
          <= (long)uVar11) {
        fail("assertion %s failed at %s +%d\n","i < int(v.size())",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,0x1e);
      }
      uVar1 = piVar3[uVar11];
      uVar8 = (ulong)uVar1;
      if ((char)iVar10 == '\0') {
        if (-1 < (int)uVar1) {
          subtract_from<int>(contexts_generated,
                             (pCVar4->
                             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar8);
          unite_with<int>((pCVar4->
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar8,contexts_generated);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    r = ",8);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", $v_r$ = ",10);
        if ((int)uVar1 < 0) {
          if (uVar8 == 0xffffff9c) {
            lVar7 = 5;
            pcVar9 = "zero\n";
          }
          else {
            if (uVar1 != 0xfffffe4f) goto LAB_00242064;
            lVar7 = 7;
            pcVar9 = "marker\n";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"$\\tau_r$ = ",0xb);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar1);
          local_4e = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4e,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"    CONTEXTS_GENERATED = ",0x19);
          pGVar5 = local_38;
          print_set(contexts_generated,
                    (local_38->
                    super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ",0x19);
          pCVar4 = local_48;
          print_set((local_48->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar8,
                    (pGVar5->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - CONTEXTS_$\\tau_r$",0x41);
          subtract_from<int>(contexts_generated,
                             (pCVar4->
                             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_GENERATED = ",0x1a);
          print_set(contexts_generated,
                    (pGVar5->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U CONTEXTS_GENERATED",0x40);
          unite_with<int>((pCVar4->
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar8,contexts_generated);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ",0x19);
          iVar10 = local_4c;
          print_set((pCVar4->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar8,
                    (pGVar5->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr);
          lVar7 = 1;
          pcVar9 = "\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar7);
      }
LAB_00242064:
      if ((long)uVar11 < 1) {
        return;
      }
      uVar11 = uVar11 - 1;
      pCVar4 = local_48;
      sVar2 = (contexts_generated->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
  }
  return;
}

Assistant:

static void context_adding_routine(std::vector<int> const& lane,
    int zeta_pointer, Context& contexts_generated, Contexts& contexts,
    bool verbose, GrammarPtr grammar) {
  if (verbose) {
    std::cerr << "  CONTEXT ADDING ROUTINE\n";
    std::cerr << "  LANE:";
    print_stack(lane);
    std::cerr << "  $\\zeta$-POINTER = " << zeta_pointer << '\n';
  }
  for (int r = zeta_pointer; r >= 0 && (!contexts_generated.empty()); --r) {
    auto v_r = at(lane, r);
    if (verbose) std::cerr << "    r = " << r << ", $v_r$ = ";
    if (v_r < 0) {
      if (verbose) {
        if (v_r == MARKER)
          std::cerr << "marker\n";
        else if (v_r == ZERO)
          std::cerr << "zero\n";
      }
      continue;
    }
    auto tau_r_addr = v_r;
    if (verbose) {
      std::cerr << "$\\tau_r$ = " << tau_r_addr << '\n';
      std::cerr << "    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - "
                   "CONTEXTS_$\\tau_r$";
    }
    subtract_from(contexts_generated, at(contexts, tau_r_addr));
    if (verbose) {
      std::cerr << "\n    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U "
                   "CONTEXTS_GENERATED";
    }
    unite_with(at(contexts, tau_r_addr), contexts_generated);
    if (verbose) {
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n";
    }
  }
}